

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O1

S1ChordAngle __thiscall S2Cell::GetMaxDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  VType a_00;
  S1ChordAngle SVar1;
  S1ChordAngle SVar2;
  S2Point local_50;
  S2Point local_38;
  
  SVar1 = GetMaxDistance(this,a);
  SVar2 = GetMaxDistance(this,b);
  if (SVar2.length2_ <= SVar1.length2_) {
    SVar2 = SVar1;
  }
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_50,2.0);
  if (local_50.c_[0] < SVar2.length2_) {
    S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_50,4.0);
    a_00 = local_50.c_[0];
    local_50.c_[2] = -a->c_[2];
    local_50.c_[0] = -a->c_[0];
    local_50.c_[1] = -a->c_[1];
    local_38.c_[2] = -b->c_[2];
    local_38.c_[0] = -b->c_[0];
    local_38.c_[1] = -b->c_[1];
    SVar2 = GetDistance(this,&local_50,&local_38);
    SVar2 = operator-((S1ChordAngle)a_00,SVar2);
  }
  return (S1ChordAngle)SVar2.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetMaxDistance(const S2Point& a, const S2Point& b) const {
  // If the maximum distance from both endpoints to the cell is less than Pi/2
  // then the maximum distance from the edge to the cell is the maximum of the
  // two endpoint distances.
  S1ChordAngle max_dist = max(GetMaxDistance(a), GetMaxDistance(b));
  if (max_dist <= S1ChordAngle::Right()) {
    return max_dist;
  }

  return S1ChordAngle::Straight() - GetDistance(-a, -b);
}